

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QBGPlanner_TreeIncPruneBnB.cpp
# Opt level: O1

void __thiscall
QBGPlanner_TreeIncPruneBnB::QBGPlanner_TreeIncPruneBnB
          (QBGPlanner_TreeIncPruneBnB *this,PlanningUnitDecPOMDPDiscrete *pu)

{
  undefined1 auVar1 [32];
  
  MonahanBGPlanner::MonahanBGPlanner(&this->super_MonahanBGPlanner,pu,true);
  (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.super_TimedAlgorithm
  ._vptr_TimedAlgorithm = (_func_int **)&PTR__QBGPlanner_TreeIncPruneBnB_005ab310;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  this->_m_Gaoa =
       (multi_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>_>
        *)auVar1._0_8_;
  this->_m_heuristic_for_depth =
       (vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        )auVar1._8_24_;
  this->_m_union_nodes_at_level =
       (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>)auVar1._0_24_;
  (this->_m_cs_nodes_at_level).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar1._24_8_;
  *(undefined1 (*) [32])
   &(this->_m_union_nodes_at_level).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ZEXT1632(ZEXT816(0) << 0x40);
  this->_m_pruneAfterUnion = true;
  this->_m_pruneAfterCrossSum = true;
  this->_m_useVectorCache = true;
  Timing::Timing(&this->_m_timing);
  return;
}

Assistant:

QBGPlanner_TreeIncPruneBnB::QBGPlanner_TreeIncPruneBnB(const PlanningUnitDecPOMDPDiscrete* pu) :
    MonahanBGPlanner(pu),
    _m_Gaoa(0),
    _m_pruneAfterUnion(true),
    _m_pruneAfterCrossSum(true),
    _m_useVectorCache(true)
{
}